

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O1

string * google::protobuf::compiler::php::anon_unknown_2::PhpName
                   (string *__return_storage_ptr__,string *full_name,Options *options)

{
  char cVar1;
  long *plVar2;
  size_type *psVar3;
  long *plVar4;
  ulong uVar5;
  bool bVar6;
  string segment;
  long *local_b8;
  long local_a8;
  long lStack_a0;
  string local_98;
  string local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  string local_50;
  
  if (options->is_descriptor == true) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,kDescriptorPackageName_abi_cxx11_._M_dataplus._M_p,
               kDescriptorPackageName_abi_cxx11_._M_dataplus._M_p +
               kDescriptorPackageName_abi_cxx11_._M_string_length);
  }
  else {
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    local_78._M_string_length = 0;
    local_78.field_2._M_local_buf[0] = '\0';
    local_58 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    if (full_name->_M_string_length != 0) {
      bVar6 = true;
      uVar5 = 0;
      do {
        cVar1 = (full_name->_M_dataplus)._M_p[uVar5];
        if (((bVar6) && ((byte)(cVar1 + 0x9fU) < 0x1a)) || (cVar1 != '.')) {
          std::__cxx11::string::push_back((char)&local_78);
          bVar6 = false;
        }
        else {
          ClassNamePrefix(&local_50,&local_78);
          plVar2 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_50,(ulong)local_78._M_dataplus._M_p);
          psVar3 = (size_type *)(plVar2 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar2 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar3) {
            local_98.field_2._M_allocated_capacity = *psVar3;
            local_98.field_2._8_8_ = plVar2[3];
            local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          }
          else {
            local_98.field_2._M_allocated_capacity = *psVar3;
            local_98._M_dataplus._M_p = (pointer)*plVar2;
          }
          local_98._M_string_length = plVar2[1];
          *plVar2 = (long)psVar3;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          plVar2 = (long *)std::__cxx11::string::_M_replace_aux
                                     ((ulong)&local_98,local_98._M_string_length,0,'\x01');
          plVar4 = plVar2 + 2;
          if ((long *)*plVar2 == plVar4) {
            local_a8 = *plVar4;
            lStack_a0 = plVar2[3];
            local_b8 = &local_a8;
          }
          else {
            local_a8 = *plVar4;
            local_b8 = (long *)*plVar2;
          }
          *plVar2 = (long)plVar4;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_b8);
          if (local_b8 != &local_a8) {
            operator_delete(local_b8);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          bVar6 = true;
          std::__cxx11::string::_M_replace
                    ((ulong)&local_78,0,(char *)local_78._M_string_length,0x3e25d9);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < full_name->_M_string_length);
    }
    ClassNamePrefix(&local_98,&local_78);
    plVar2 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_98,(ulong)local_78._M_dataplus._M_p);
    plVar4 = plVar2 + 2;
    if ((long *)*plVar2 == plVar4) {
      local_a8 = *plVar4;
      lStack_a0 = plVar2[3];
      local_b8 = &local_a8;
    }
    else {
      local_a8 = *plVar4;
      local_b8 = (long *)*plVar2;
    }
    *plVar2 = (long)plVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_b8);
    if (local_b8 != &local_a8) {
      operator_delete(local_b8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string PhpName(const std::string& full_name, const Options& options) {
  if (options.is_descriptor) {
    return kDescriptorPackageName;
  }

  std::string segment;
  std::string result;
  bool cap_next_letter = true;
  for (int i = 0; i < full_name.size(); i++) {
    if ('a' <= full_name[i] && full_name[i] <= 'z' && cap_next_letter) {
      segment += full_name[i] + ('A' - 'a');
      cap_next_letter = false;
    } else if (full_name[i] == '.') {
      result += ClassNamePrefix(segment) + segment + '\\';
      segment = "";
      cap_next_letter = true;
    } else {
      segment += full_name[i];
      cap_next_letter = false;
    }
  }
  result += ClassNamePrefix(segment) + segment;
  return result;
}